

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_mul_n_by_m_template.h
# Opt level: O1

bool __thiscall
test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int>::do_test
          (test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int> *this,
          size_t rounds)

{
  anon_class_32_4_006e9c57 parallel_function;
  ostream *poVar1;
  bool bVar2;
  size_t sVar3;
  bool result_is_ok;
  atomic_flag test_lock;
  atomic_flag *in_stack_ffffffffffffffa0;
  byte local_52 [2];
  size_t local_50;
  byte *local_48;
  byte *pbStack_40;
  test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int> *local_38;
  
  if (rounds == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    sVar3 = 0;
    local_50 = rounds;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"initialize()       boost compare with uintwide_t: round ",
                 0x38);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[3])(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_mul()  boost compare with uintwide_t: round ",
                 0x38);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      local_52[0] = 1;
      local_52[1] = 0;
      local_48 = local_52 + 1;
      pbStack_40 = local_52;
      parallel_function.u_boost =
           (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
            **)pbStack_40;
      parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_48;
      parallel_function.distribution = (distribution_type *)this;
      parallel_function.rnd_lock = in_stack_ffffffffffffffa0;
      local_38 = this;
      my_concurrency::
      parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288u,8192u,unsigned_int>::test_binary_mul()const::_lambda(unsigned_long)_1_>
                (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
                   number_of_cases,parallel_function);
      bVar2 = (bool)(bVar2 & local_52[0]);
      sVar3 = sVar3 + 1;
    } while (local_50 != sVar3);
  }
  return bVar2;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);
      }

      return result_is_ok;
    }